

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O2

void __thiscall embree::BVHN<4>::layoutLargeNodes(BVHN<4> *this,size_t num)

{
  NodeArea *pNVar1;
  ulong *puVar2;
  NodeRef *node;
  BVHN<4> *this_00;
  __uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  *p_Var3;
  __uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  this_01;
  NodeRef NVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  float *pfVar7;
  float fVar8;
  vector<NodeArea,_std::allocator<NodeArea>_> lst;
  Lock<embree::MutexSys> lock;
  _Vector_base<NodeArea,_std::allocator<NodeArea>_> local_88;
  unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  local_70;
  NodeRef *local_68;
  BVHN<4> *local_60;
  Lock<embree::MutexSys> local_58;
  undefined1 local_48 [8];
  ThreadLocal *local_40;
  ThreadLocal *local_38;
  
  local_88._M_impl.super__Vector_impl_data._M_start = (NodeArea *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (NodeArea *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<NodeArea,_std::allocator<NodeArea>_>::reserve
            ((vector<NodeArea,_std::allocator<NodeArea>_> *)&local_88,num);
  local_68 = &this->root;
  local_40 = (ThreadLocal *)
             CONCAT44(local_40._4_4_,
                      *(float *)(&DAT_01f51028 + (ulong)(((this->root).ptr & 8) == 0) * 4));
  local_60 = this;
  local_48 = (undefined1  [8])local_68;
  std::
  vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>
  ::emplace_back<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>
            ((vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>
              *)&local_88,(NodeArea *)local_48);
  while( true ) {
    if (num <= (ulong)((long)local_88._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_88._M_impl.super__Vector_impl_data._M_start >> 4)) break;
    std::
    pop_heap<__gnu_cxx::__normal_iterator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea*,std::vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>>>
              ((__normal_iterator<NodeArea_*,_std::vector<NodeArea,_std::allocator<NodeArea>_>_>)
               local_88._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<NodeArea_*,_std::vector<NodeArea,_std::allocator<NodeArea>_>_>)
               local_88._M_impl.super__Vector_impl_data._M_finish);
    pNVar1 = local_88._M_impl.super__Vector_impl_data._M_finish + -1;
    local_88._M_impl.super__Vector_impl_data._M_finish =
         local_88._M_impl.super__Vector_impl_data._M_finish + -1;
    uVar5 = pNVar1->node->ptr;
    if ((uVar5 & 0xf) != 0) break;
    pfVar7 = (float *)(uVar5 + 0x70);
    for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
      if (*(long *)(uVar5 + lVar6) != 8) {
        local_48 = (undefined1  [8])(lVar6 + uVar5);
        fVar8 = -INFINITY;
        if (((ulong)((FastAllocator *)local_48)->device & 8) == 0) {
          fVar8 = ((pfVar7[-8] - pfVar7[-0xc]) + (*pfVar7 - pfVar7[-4])) *
                  (pfVar7[-0x10] - pfVar7[-0x14]) +
                  (*pfVar7 - pfVar7[-4]) * (pfVar7[-8] - pfVar7[-0xc]);
          fVar8 = fVar8 + fVar8;
        }
        local_40 = (ThreadLocal *)CONCAT44(local_40._4_4_,fVar8);
        std::
        vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>
        ::emplace_back<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>
                  ((vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>
                    *)&local_88,(NodeArea *)local_48);
        std::
        push_heap<__gnu_cxx::__normal_iterator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea*,std::vector<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea,std::allocator<embree::BVHN<4>::layoutLargeNodes(unsigned_long)::NodeArea>>>>
                  ((__normal_iterator<NodeArea_*,_std::vector<NodeArea,_std::allocator<NodeArea>_>_>
                   )local_88._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<NodeArea_*,_std::vector<NodeArea,_std::allocator<NodeArea>_>_>
                   )local_88._M_impl.super__Vector_impl_data._M_finish);
      }
      pfVar7 = pfVar7 + 1;
    }
  }
  this_00 = local_60;
  node = local_68;
  lVar6 = 0;
  uVar5 = 0;
  while( true ) {
    if ((ulong)((long)local_88._M_impl.super__Vector_impl_data._M_finish -
                (long)local_88._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar5) break;
    puVar2 = *(ulong **)((long)&(local_88._M_impl.super__Vector_impl_data._M_start)->node + lVar6);
    *puVar2 = *puVar2 | 0x8000000000000000;
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x10;
  }
  p_Var3 = (__uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            *)__tls_get_addr(&PTR_021f8d38);
  this_01._M_t.
  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl = p_Var3->_M_t;
  if ((_Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
       )this_01._M_t.
        super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
        .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl ==
      (ThreadLocal2 *)0x0) {
    this_01._M_t.
    super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
    .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
         (tuple<embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
          )FastAllocator::ThreadLocal2::operator_new(0xc0);
    MutexSys::MutexSys((MutexSys *)
                       this_01._M_t.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl);
    (((atomic<embree::FastAllocator_*> *)
     ((long)this_01._M_t.
            super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 8))
    ->_M_b)._M_p = (__pointer_type)0x0;
    ((ThreadLocal *)
    ((long)this_01._M_t.
           super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
           .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 0x40)
    )->parent = (ThreadLocal2 *)
                this_01._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
    *(void **)((long)this_01._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x48) = (void *)0x0;
    *(void **)((long)this_01._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x50) = (void *)0x0;
    *(void **)((long)this_01._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x58) = (void *)0x0;
    *(void **)((long)this_01._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x60) = (void *)0x0;
    *(void **)((long)this_01._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x68) = (void *)0x0;
    *(void **)((long)this_01._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x70) = (void *)0x0;
    ((ThreadLocal *)
    ((long)this_01._M_t.
           super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
           .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 0x80)
    )->parent = (ThreadLocal2 *)
                this_01._M_t.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
    *(void **)((long)this_01._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x88) = (void *)0x0;
    *(void **)((long)this_01._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x90) = (void *)0x0;
    *(void **)((long)this_01._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x98) = (void *)0x0;
    *(void **)((long)this_01._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0xa0) = (void *)0x0;
    *(void **)((long)this_01._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0xa8) = (void *)0x0;
    *(void **)((long)this_01._M_t.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0xb0) = (void *)0x0;
    p_Var3->_M_t = this_01._M_t.
                   super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                   .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl
    ;
    local_58.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_58.locked = true;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    local_70._M_t.
    super___uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
    .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
         (__uniq_ptr_data<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>,_true,_true>
          )(__uniq_ptr_data<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>,_true,_true>
            )this_01._M_t.
             super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
             .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
    ::
    emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
              ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                *)FastAllocator::s_thread_local_allocators,&local_70);
    std::
    unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
    ::~unique_ptr(&local_70);
    Lock<embree::MutexSys>::~Lock(&local_58);
  }
  local_48 = (undefined1  [8])&this_00->alloc;
  local_40 = (ThreadLocal *)
             ((long)this_01._M_t.
                    super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                    .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                    _M_head_impl + 0x40);
  local_38 = (ThreadLocal *)
             ((long)this_01._M_t.
                    super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                    .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                    _M_head_impl + 0x80);
  if ((this_00->alloc).use_single_mode != false) {
    local_38 = local_40;
  }
  NVar4 = layoutLargeNodesRecursion(this_00,node,(CachedAllocator *)local_48);
  node->ptr = NVar4.ptr;
  std::_Vector_base<NodeArea,_std::allocator<NodeArea>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void BVHN<N>::layoutLargeNodes(size_t num)
  {
#if defined(__64BIT__) // do not use tree rotations on 32 bit platforms, barrier bit in NodeRef will cause issues
    struct NodeArea 
    {
      __forceinline NodeArea() {}

      __forceinline NodeArea(NodeRef& node, const BBox3fa& bounds)
        : node(&node), A(node.isLeaf() ? float(neg_inf) : area(bounds)) {}

      __forceinline bool operator< (const NodeArea& other) const {
        return this->A < other.A;
      }

      NodeRef* node;
      float A;
    };
    std::vector<NodeArea> lst;
    lst.reserve(num);
    lst.push_back(NodeArea(root,empty));

    while (lst.size() < num)
    {
      std::pop_heap(lst.begin(), lst.end());
      NodeArea n = lst.back(); lst.pop_back();
      if (!n.node->isAABBNode()) break;
      AABBNode* node = n.node->getAABBNode();
      for (size_t i=0; i<N; i++) {
        if (node->child(i) == BVHN::emptyNode) continue;
        lst.push_back(NodeArea(node->child(i),node->bounds(i)));
        std::push_heap(lst.begin(), lst.end());
      }
    }

    for (size_t i=0; i<lst.size(); i++)
      lst[i].node->setBarrier();
      
    root = layoutLargeNodesRecursion(root,alloc.getCachedAllocator());
#endif
  }